

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Header.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Minefield_Header::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Minefield_Header *this)

{
  ostream *poVar1;
  ulong uVar2;
  char cVar3;
  KString local_380;
  string local_360 [32];
  KStringStream ss;
  ostream local_330 [376];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_330,"Minefield ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_380,&this->m_MinefieldID);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,'\t');
  uVar2 = 0;
  while( true ) {
    uVar2 = uVar2 & 0xffff;
    if (local_380._M_string_length <= uVar2) break;
    cVar3 = local_380._M_dataplus._M_p[uVar2];
    if (local_380._M_string_length - 1 != uVar2 && cVar3 == '\n') {
      cVar3 = '\t';
      std::operator<<(local_1a8,'\n');
    }
    std::operator<<(local_1a8,cVar3);
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  poVar1 = std::operator<<(poVar1,local_360);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString Minefield_Header::GetAsString() const
{
    KStringStream ss;

    ss << "Minefield ID:\n"
       << IndentString( m_MinefieldID.GetAsString(), 1 )
       << "\n";

    return ss.str();
}